

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeInternalForces
          (ChElementShellANCF_3423 *this,ChVectorDynamic<> *Fi)

{
  ChMatrixNM<double,_8,_3> *d;
  undefined8 *puVar1;
  pointer pMVar2;
  pointer pdVar3;
  double *pdVar4;
  pointer pMVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  ChLog *this_00;
  ChStreamOutAscii *pCVar9;
  ulong uVar10;
  ulong uVar11;
  uint unVal;
  ActualDstType actualDst;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [8];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [8];
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [8];
  double dVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [8];
  ChVectorN<double,_5> alphaEAS;
  ShellANCF_Force formula;
  ChVectorN<double,_5> HE;
  ChVectorN<double,_5> sol;
  ChVectorN<double,_54> result;
  type tmp;
  undefined8 auStack_79f [8];
  undefined8 auStack_75f [2];
  code *pcStack_748;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  double local_700;
  ChVectorDynamic<> *local_6f0;
  long local_6e8;
  undefined1 local_6e0 [8];
  double local_6d8;
  ChIntegrable3D<Eigen::Matrix<double,_54,_1,_0,_54,_1>_> local_6d0;
  ChElementShellANCF_3423 *local_6c8;
  ulong local_6c0;
  undefined1 *local_6b8;
  double local_6b0;
  double dStack_6a8;
  undefined1 local_6a0 [8];
  double dStack_698;
  double local_690;
  double dStack_688;
  double local_680;
  double dStack_678;
  double local_670;
  double dStack_668;
  undefined1 local_660 [8];
  double dStack_658;
  double local_650;
  double dStack_648;
  double local_640;
  double dStack_638;
  double local_630;
  double dStack_628;
  undefined1 local_620 [8];
  double dStack_618;
  double local_610;
  double dStack_608;
  double local_600;
  double dStack_5f8;
  Matrix<double,_5,_1,_0,_5,_1> local_5f0;
  Matrix<double,_5,_1,_0,_5,_1> local_5c0;
  double dStack_598;
  double dStack_590;
  double dStack_588;
  double local_580;
  double dStack_578;
  double dStack_570;
  double dStack_568;
  double dStack_560;
  double dStack_558;
  double dStack_550;
  double dStack_548;
  double local_540;
  double dStack_538;
  double dStack_530;
  double dStack_528;
  double dStack_520;
  double dStack_518;
  double dStack_510;
  double dStack_508;
  Matrix<double,_54,_1,_0,_54,_1> local_500;
  double local_340;
  double dStack_338;
  double dStack_330;
  double dStack_328;
  double dStack_320;
  double dStack_318;
  double dStack_310;
  double dStack_308;
  double local_300;
  double dStack_2f8;
  double dStack_2f0;
  double dStack_2e8;
  double dStack_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double dStack_2c8;
  double local_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double dStack_2a8;
  double dStack_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  undefined1 local_280 [424];
  undefined2 local_d8;
  undefined8 auStack_c0 [18];
  
  d = &this->m_d;
  pcStack_748 = (code *)0x74d13d;
  CalcCoordMatrix(this,d);
  pcStack_748 = (code *)0x74d14c;
  CalcCoordDerivMatrix(this,&this->m_d_dt);
  pcStack_748 = (code *)0x74d16b;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.array[0]
       = (double)d;
  local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.array[1]
       = (double)d;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,8,8,0,8,8>>
            ((Matrix<double,_8,_8,_0,_8,_8> *)local_280,d,
             (Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_> *)
             (local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
              m_data.array + 1));
  lVar8 = 0x51f;
  do {
    *(undefined8 *)((long)this + lVar8 * 8 + -0x38) = *(undefined8 *)((long)auStack_79f + lVar8);
    *(undefined8 *)((long)this + lVar8 * 8 + -0x30) = *(undefined8 *)((long)auStack_75f + lVar8);
    *(undefined8 *)((long)this + lVar8 * 8 + -0x28) = *(undefined8 *)(local_720 + lVar8 + 1);
    *(undefined8 *)((long)this + lVar8 * 8 + -0x20) = *(undefined8 *)(local_6e0 + lVar8 + 1);
    *(undefined8 *)((long)this + lVar8 * 8 + -0x18) = *(undefined8 *)(local_6a0 + lVar8 + 1);
    *(undefined8 *)((long)this + lVar8 * 8 + -0x10) = *(undefined8 *)(local_660 + lVar8 + 1);
    *(undefined8 *)((long)this + lVar8 * 8 + -8) = *(undefined8 *)(local_620 + lVar8 + 1);
    (&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase)[lVar8].
    _vptr_ChElementBase =
         *(_func_int ***)
          ((long)local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                 m_data.array + lVar8 + 0x11);
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x55f);
  pcStack_748 = (code *)0x74d1f7;
  CalcStrainANSbilinearShell(this);
  lVar8 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar8 < 0) {
    pcStack_748 = CalcCoordDerivMatrix;
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar8 != 0) {
    pcStack_748 = (code *)0x74d214;
    memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar8 << 3);
  }
  if (this->m_numLayers != 0) {
    uVar11 = 0;
    local_6f0 = Fi;
    do {
      local_6e8 = uVar11 * 5;
      pMVar2 = (this->m_alphaEAS).
               super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_700 = *(double *)
                   ((long)&pMVar2[uVar11].
                           super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                           m_data + 0x20);
      pMVar2 = pMVar2 + uVar11;
      local_720 = *(undefined1 (*) [16])
                   &(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage
                    .m_data;
      auStack_710 = *(undefined1 (*) [16])
                     ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).
                             m_storage.m_data + 0x10);
      unVal = 0;
      do {
        local_6d0._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_00b5f5c8;
        local_6b8 = local_720;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x30] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x31] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x32] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x33] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x34] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x35] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x28] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x29] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2a] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2b] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2c] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2d] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2e] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x2f] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x20] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x21] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x22] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x23] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x24] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x25] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x26] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x27] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x18] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x19] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1a] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1b] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1c] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1d] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1e] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x1f] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x10] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x11] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x12] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x13] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x14] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x15] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x16] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0x17] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[8] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[9] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[10] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xb] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xd] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xe] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0xf] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[0] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[1] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[2] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[3] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[4] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[5] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[6] = 0.0;
        local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.m_data.
        array[7] = 0.0;
        pdVar3 = (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcStack_748 = (code *)0x74d306;
        local_6c8 = this;
        local_6c0 = uVar11;
        ChQuadrature::Integrate3D<Eigen::Matrix<double,54,1,0,54,1>>
                  (&local_500,&local_6d0,-1.0,1.0,-1.0,1.0,pdVar3[uVar11],pdVar3[uVar11 + 1],2);
        local_2c0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0];
        dStack_2b8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[1];
        dStack_2b0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[2];
        dStack_2a8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[3];
        dStack_2a0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[4];
        dStack_298 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[5];
        dStack_290 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[6];
        dStack_288 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[7];
        local_340 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[8];
        dStack_338 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[9];
        dStack_330 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[10];
        dStack_328 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xb];
        dStack_320 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xc];
        dStack_318 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xd];
        dStack_310 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xe];
        dStack_308 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0xf];
        local_300 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x10];
        dStack_2f8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x11];
        dStack_2f0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x12];
        dStack_2e8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x13];
        dStack_2e0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x14];
        dStack_2d8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x15];
        dStack_2d0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x16];
        dStack_2c8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x17];
        local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[0] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x18];
        local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[1] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x19];
        local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[2] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1a];
        local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[3] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1b];
        local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
        array[4] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1c];
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1c] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1c] +
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x18] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x18] +
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1a] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1a] +
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x19] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x19] +
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1b] *
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1b];
        auVar13 = vsqrtsd_avx(auVar13,auVar13);
        if (auVar13._0_8_ < 1e-05) {
          local_580 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                      m_storage.m_data.array[8];
          dStack_578 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[9];
          dStack_570 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[10];
          dStack_568 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0xb];
          dStack_560 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0xc];
          dStack_558 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0xd];
          dStack_550 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0xe];
          dStack_548 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0xf];
          local_540 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                      m_storage.m_data.array[0x10];
          dStack_538 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0x11];
          dStack_530 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0x12];
          dStack_528 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0x13];
          dStack_520 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0x14];
          dStack_518 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0x15];
          dStack_510 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0x16];
          dStack_508 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[0x17];
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[0] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0];
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[1] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[1];
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[2] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[2];
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[3] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[3];
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[4] = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[4];
          dStack_598 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[5];
          dStack_590 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[6];
          dStack_588 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                       m_storage.m_data.array[7];
          auVar38 = (undefined1  [8])
                    local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x35];
          dVar14 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1d];
          dVar15 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1e];
          dVar16 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x1f];
          dVar17 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x20];
          auVar18 = (undefined1  [8])
                    local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x21];
          dVar19 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x22];
          dVar20 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x23];
          dVar21 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x24];
          dVar22 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x25];
          dVar23 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x26];
          dVar24 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x27];
          dVar25 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x28];
          auVar26 = (undefined1  [8])
                    local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x29];
          dVar27 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2a];
          dVar28 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2b];
          dVar29 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2c];
          dVar30 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2d];
          dVar31 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2e];
          dVar32 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x2f];
          dVar33 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x30];
          auVar34 = (undefined1  [8])
                    local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x31];
          dVar35 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x32];
          dVar36 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x33];
          dVar37 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                   m_storage.m_data.array[0x34];
          goto LAB_0074d6a8;
        }
        local_d8._0_1_ = false;
        local_d8._1_1_ = false;
        local_600 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x1d];
        dStack_5f8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x1e];
        local_280._0_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1d];
        local_280._8_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1e];
        local_610 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x1f];
        dStack_608 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x20];
        local_280._16_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x1f];
        local_280._24_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x20];
        local_620 = (undefined1  [8])
                    local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x21];
        dStack_618 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x22];
        local_280._32_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x21];
        local_280._40_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x22];
        local_630 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x23];
        dStack_628 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x24];
        local_280._48_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x23];
        local_280._56_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x24];
        local_640 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x25];
        dStack_638 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x26];
        local_280._64_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x25];
        local_280._72_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x26];
        local_650 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x27];
        dStack_648 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x28];
        local_280._80_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x27];
        local_280._88_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x28];
        local_660 = (undefined1  [8])
                    local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x29];
        dStack_658 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x2a];
        local_280._96_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x29];
        local_280._104_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2a];
        local_670 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x2b];
        dStack_668 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x2c];
        local_280._112_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2b];
        local_280._120_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2c];
        local_680 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x2d];
        dStack_678 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x2e];
        local_280._128_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2d];
        local_280._136_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2e];
        local_690 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x2f];
        dStack_688 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x30];
        local_280._144_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x2f];
        local_280._152_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x30];
        local_6a0 = (undefined1  [8])
                    local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x31];
        dStack_698 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x32];
        local_280._160_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x31];
        local_280._168_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x32];
        local_6b0 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x33];
        dStack_6a8 = local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                     m_storage.m_data.array[0x34];
        local_280._176_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x33];
        local_280._184_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x34];
        local_6e0 = (undefined1  [8])
                    local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.
                    m_storage.m_data.array[0x35];
        local_280._192_8_ =
             local_500.super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>.m_storage.
             m_data.array[0x35];
        pcStack_748 = (code *)0x74d511;
        local_6d8 = auVar13._0_8_;
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>::computeInPlace
                  ((ColPivHouseholderQR<Eigen::Matrix<double,_5,_5,_1,_5,_5>_> *)local_280);
        if (local_d8._0_1_ == false) {
          local_580 = local_340;
          dStack_578 = dStack_338;
          dStack_570 = dStack_330;
          dStack_568 = dStack_328;
          dStack_560 = dStack_320;
          dStack_558 = dStack_318;
          dStack_550 = dStack_310;
          dStack_548 = dStack_308;
          local_540 = local_300;
          dStack_538 = dStack_2f8;
          dStack_530 = dStack_2f0;
          dStack_528 = dStack_2e8;
          dStack_520 = dStack_2e0;
          dStack_518 = dStack_2d8;
          dStack_510 = dStack_2d0;
          dStack_508 = dStack_2c8;
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[0] = local_2c0;
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[1] = dStack_2b8;
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[2] = dStack_2b0;
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[3] = dStack_2a8;
          local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
          array[4] = dStack_2a0;
          dStack_598 = dStack_298;
          dStack_590 = dStack_290;
          dStack_588 = dStack_288;
          pcStack_748 = (code *)0x74d7f1;
          __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                        "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                        "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 5, 5, 1>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 5, 5, 1>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Matrix<double, 5, 1, 0, 5, 1>>]"
                       );
        }
        pcStack_748 = (code *)0x74d537;
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>>::
        _solve_impl<Eigen::Matrix<double,5,1,0,5,1>,Eigen::Matrix<double,5,1,0,5,1>>
                  ((ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>> *)local_280,&local_5f0,
                   &local_5c0);
        auVar6._8_8_ = local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                       m_storage.m_data.array[1];
        auVar6._0_8_ = local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                       m_storage.m_data.array[0];
        local_720 = vsubpd_avx(local_720,auVar6);
        auVar7._8_8_ = local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                       m_storage.m_data.array[3];
        auVar7._0_8_ = local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                       m_storage.m_data.array[2];
        auStack_710 = vsubpd_avx(auStack_710,auVar7);
        local_700 = local_700 -
                    local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                    .m_data.array[4];
        if (1 < unVal) {
          pcStack_748 = (code *)0x74d581;
          this_00 = GetLog();
          pcStack_748 = (code *)0x74d590;
          pCVar9 = ChStreamOutAscii::operator<<(&this_00->super_ChStreamOutAscii,"  count ");
          pcStack_748 = (code *)0x74d59b;
          pCVar9 = ChStreamOutAscii::operator<<(pCVar9,unVal);
          pcStack_748 = (code *)0x74d5aa;
          pCVar9 = ChStreamOutAscii::operator<<(pCVar9,"  NormHE ");
          pcStack_748 = (code *)0x74d5b8;
          pCVar9 = ChStreamOutAscii::operator<<(pCVar9,local_6d8);
          pcStack_748 = (code *)0x74d5c7;
          ChStreamOutAscii::operator<<(pCVar9,"\n");
        }
        unVal = unVal + 1;
      } while (unVal != 100);
      local_580 = local_340;
      dStack_578 = dStack_338;
      dStack_570 = dStack_330;
      dStack_568 = dStack_328;
      dStack_560 = dStack_320;
      dStack_558 = dStack_318;
      dStack_550 = dStack_310;
      dStack_548 = dStack_308;
      local_540 = local_300;
      dStack_538 = dStack_2f8;
      dStack_530 = dStack_2f0;
      dStack_528 = dStack_2e8;
      dStack_520 = dStack_2e0;
      dStack_518 = dStack_2d8;
      dStack_510 = dStack_2d0;
      dStack_508 = dStack_2c8;
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [0] = local_2c0;
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [1] = dStack_2b8;
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [2] = dStack_2b0;
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [3] = dStack_2a8;
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [4] = dStack_2a0;
      dStack_598 = dStack_298;
      dStack_590 = dStack_290;
      dStack_588 = dStack_288;
      auVar38 = local_6e0;
      dVar14 = local_600;
      dVar15 = dStack_5f8;
      dVar16 = local_610;
      dVar17 = dStack_608;
      auVar18 = local_620;
      dVar19 = dStack_618;
      dVar20 = local_630;
      dVar21 = dStack_628;
      dVar22 = local_640;
      dVar23 = dStack_638;
      dVar24 = local_650;
      dVar25 = dStack_648;
      auVar26 = local_660;
      dVar27 = dStack_658;
      dVar28 = local_670;
      dVar29 = dStack_668;
      dVar30 = local_680;
      dVar31 = dStack_678;
      dVar32 = local_690;
      dVar33 = dStack_688;
      auVar34 = local_6a0;
      dVar35 = dStack_698;
      dVar36 = local_6b0;
      dVar37 = dStack_6a8;
LAB_0074d6a8:
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [0] = local_2c0;
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [1] = dStack_2b8;
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [2] = dStack_2b0;
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [3] = dStack_2a8;
      local_5c0.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [4] = dStack_2a0;
      dStack_598 = dStack_298;
      dStack_590 = dStack_290;
      dStack_588 = dStack_288;
      local_580 = local_340;
      dStack_578 = dStack_338;
      dStack_570 = dStack_330;
      dStack_568 = dStack_328;
      dStack_560 = dStack_320;
      dStack_558 = dStack_318;
      dStack_550 = dStack_310;
      dStack_548 = dStack_308;
      local_540 = local_300;
      dStack_538 = dStack_2f8;
      dStack_530 = dStack_2f0;
      dStack_528 = dStack_2e8;
      dStack_520 = dStack_2e0;
      dStack_518 = dStack_2d8;
      dStack_510 = dStack_2d0;
      dStack_508 = dStack_2c8;
      if ((local_6f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows != 0x18) {
        pcStack_748 = (code *)0x74d813;
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, 24, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
                     );
      }
      pdVar4 = (local_6f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      uVar10 = 0xfffffffffffffff8;
      do {
        auVar12 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar4 + uVar10 + 8),
                                 *(undefined1 (*) [64])(&local_580 + uVar10));
        *(undefined1 (*) [64])(pdVar4 + uVar10 + 8) = auVar12;
        uVar10 = uVar10 + 8;
      } while (uVar10 < 0x10);
      pMVar2 = (this->m_alphaEAS).
               super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).
                       m_storage.m_data + local_6e8 * 8);
      *puVar1 = local_720._0_8_;
      puVar1[1] = local_720._8_8_;
      puVar1 = (undefined8 *)
               ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).
                       m_storage.m_data + local_6e8 * 8 + 0x10);
      *puVar1 = auStack_710._0_8_;
      puVar1[1] = auStack_710._8_8_;
      *(double *)
       ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
               m_data + local_6e8 * 8 + 0x20) = local_700;
      pMVar5 = (this->m_KalphaEAS).
               super__Vector_base<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_std::allocator<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.m_storage.m_data.
      array[0] = dVar14;
      *(double *)
       ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.m_storage
               .m_data + 8) = dVar15;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x10);
      *pdVar4 = dVar16;
      pdVar4[1] = dVar17;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x20);
      *pdVar4 = (double)auVar18;
      pdVar4[1] = dVar19;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x30);
      *pdVar4 = dVar20;
      pdVar4[1] = dVar21;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x40);
      *pdVar4 = dVar22;
      pdVar4[1] = dVar23;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x50);
      *pdVar4 = dVar24;
      pdVar4[1] = dVar25;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x60);
      *pdVar4 = (double)auVar26;
      pdVar4[1] = dVar27;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x70);
      *pdVar4 = dVar28;
      pdVar4[1] = dVar29;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x80);
      *pdVar4 = dVar30;
      pdVar4[1] = dVar31;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0x90);
      *pdVar4 = dVar32;
      pdVar4[1] = dVar33;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0xa0);
      *pdVar4 = (double)auVar34;
      pdVar4[1] = dVar35;
      pdVar4 = (double *)
               ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                       m_storage.m_data + 0xb0);
      *pdVar4 = dVar36;
      pdVar4[1] = dVar37;
      *(undefined1 (*) [8])
       ((long)&pMVar5[uVar11].super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.m_storage
               .m_data + 0xc0) = auVar38;
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3423::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    // Current nodal coordinates and velocities
    CalcCoordMatrix(m_d);
    CalcCoordDerivMatrix(m_d_dt);
    m_ddT = m_d * m_d.transpose();
    // Assumed Natural Strain (ANS):  Calculate m_strainANS and m_strainANS_D
    CalcStrainANSbilinearShell();

    Fi.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        ChVectorN<double, 24> Finternal;
        ChVectorN<double, 5> HE;
        ChMatrixNM<double, 5, 5> KALPHA;

        // Initial guess for EAS parameters
        ChVectorN<double, 5> alphaEAS = m_alphaEAS[kl];

        // Newton loop for EAS
        for (int count = 0; count < m_maxIterationsEAS; count++) {
            ShellANCF_Force formula(this, kl, &alphaEAS);
            ChVectorN<double, 54> result;
            result.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 54>>(result,                          // result of integration
                                                             formula,                         // integrand formula
                                                             -1, 1,                           // x limits
                                                             -1, 1,                           // y limits
                                                             m_GaussZ[kl], m_GaussZ[kl + 1],  // z limits
                                                             2                                // order of integration
            );

            // Extract vectors and matrices from result of integration
            Finternal = result.segment(0, 24);
            HE = result.segment(24, 5);
            KALPHA = Eigen::Map<ChMatrixNM<double, 5, 5>>(result.segment(29, 5 * 5).data(), 5, 5);

            // Check convergence (residual check)
            double norm_HE = HE.norm();
            if (norm_HE < m_toleranceEAS)
                break;

            // Calculate increment and update EAS parameters
            ChVectorN<double, 5> sol = KALPHA.colPivHouseholderQr().solve(HE);
            alphaEAS -= sol;

            if (count >= 2)
                GetLog() << "  count " << count << "  NormHE " << norm_HE << "\n";
        }

        // Accumulate internal force
        Fi -= Finternal;

        // Cache alphaEAS and KALPHA for use in Jacobian calculation
        m_alphaEAS[kl] = alphaEAS;
        m_KalphaEAS[kl] = KALPHA;

    }  // Layer Loop
}